

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextVoid(char *str_id,int mouse_button)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiContext *g;
  char *str_id_00;
  
  str_id_00 = "void_context_menu";
  if (str_id != (char *)0x0) {
    str_id_00 = str_id;
  }
  if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
    if (4 < (uint)mouse_button) {
      __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xc54,"bool ImGui::IsMouseClicked(int, bool)");
    }
    fVar1 = (GImGui->IO).MouseDownDuration[(uint)mouse_button];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      OpenPopupEx(str_id_00,true);
    }
  }
  if ((GImGui->CurrentPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    bVar3 = BeginPopupEx(str_id_00,0x80);
    return bVar3;
  }
  pIVar2 = GImGui;
  pIVar2->SetNextWindowSizeConstraint = false;
  pIVar2->SetNextWindowFocus = false;
  pIVar2->SetNextWindowPosCond = 0;
  pIVar2->SetNextWindowSizeCond = 0;
  pIVar2->SetNextWindowContentSizeCond = 0;
  pIVar2->SetNextWindowCollapsedCond = 0;
  return false;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, int mouse_button)
{
    if (!str_id) str_id = "void_context_menu";
    if (!IsMouseHoveringAnyWindow() && IsMouseClicked(mouse_button))
        OpenPopupEx(str_id, true);
    return BeginPopup(str_id);
}